

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O1

ChCoordsys<double> * __thiscall
chrono::ChLinkDistance::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkDistance *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChBodyFrame *pCVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  char cVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ChVector<double> Vx;
  ChVector<double> D2rel;
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> local_98;
  ChVector<double> local_80;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  pCVar7 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->pos1,&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar7 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->pos2,&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  local_80.m_data[1] = local_80.m_data[1] - local_98.m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_80.m_data[1] * local_80.m_data[1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_80.m_data[0] - local_98.m_data[0];
  auVar19 = vfmadd231sd_fma(auVar19,auVar26,auVar26);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_80.m_data[2] - local_98.m_data[2];
  auVar19 = vfmadd231sd_fma(auVar19,auVar30,auVar30);
  if (auVar19._0_8_ < 0.0) {
    dVar17 = sqrt(auVar19._0_8_);
  }
  else {
    auVar19 = vsqrtsd_avx(auVar19,auVar19);
    dVar17 = auVar19._0_8_;
  }
  bVar8 = 2.2250738585072014e-308 <= dVar17;
  dVar17 = 1.0 / dVar17;
  auVar15._0_8_ =
       (ulong)bVar8 * (long)((local_80.m_data[0] - local_98.m_data[0]) * dVar17) +
       (ulong)!bVar8 * 0x3ff0000000000000;
  auVar15._8_8_ = 0;
  dVar29 = (double)((ulong)bVar8 * (long)(local_80.m_data[1] * dVar17));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (ulong)bVar8 * (long)((local_80.m_data[2] - local_98.m_data[2]) * dVar17);
  pCVar7 = (this->super_ChLink).Body2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar19 = vfmadd231sd_fma(auVar28,auVar15,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar19 = vfmadd231sd_fma(auVar19,auVar16,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar26 = vfmadd231sd_fma(auVar31,auVar15,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x38);
  auVar26 = vfmadd231sd_fma(auVar26,auVar16,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar30 = vfmadd231sd_fma(auVar27,auVar15,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar30 = vfmadd231sd_fma(auVar30,auVar16,auVar6);
  local_80.m_data[0] = auVar19._0_8_;
  local_80.m_data[1] = auVar26._0_8_;
  local_80.m_data[2] = auVar30._0_8_;
  local_98.m_data[2] = 0.0;
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  XdirToDxDyDz<double>(&local_80,(ChVector<double> *)&VECT_Y,&local_98,&local_48,&local_68);
  dVar13 = local_48.m_data[2];
  dVar12 = local_48.m_data[0];
  dVar11 = local_68.m_data[1];
  dVar29 = local_68.m_data[0];
  dVar10 = local_98.m_data[2];
  dVar9 = local_98.m_data[1];
  dVar17 = local_98.m_data[0] + local_48.m_data[1] + local_68.m_data[2];
  if (0.0 <= dVar17) {
    dVar17 = dVar17 + 1.0;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar17;
      auVar19 = vsqrtsd_avx(auVar20,auVar20);
      dVar17 = auVar19._0_8_;
    }
    dVar18 = dVar17 * 0.5;
    dVar17 = 0.5 / dVar17;
    dVar24 = (dVar13 - dVar11) * dVar17;
    dVar25 = (dVar29 - dVar10) * dVar17;
    dVar17 = (dVar9 - dVar12) * dVar17;
  }
  else {
    cVar14 = local_98.m_data[0] < local_48.m_data[1];
    dVar17 = local_98.m_data[0];
    if ((bool)cVar14) {
      dVar17 = local_48.m_data[1];
    }
    if (dVar17 < local_68.m_data[2]) {
      cVar14 = '\x02';
    }
    if (cVar14 == '\x02') {
      dVar17 = ((local_68.m_data[2] - local_98.m_data[0]) - local_48.m_data[1]) + 1.0;
      if (dVar17 < 0.0) {
        dVar18 = sqrt(dVar17);
      }
      else {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar17;
        auVar19 = vsqrtsd_avx(auVar22,auVar22);
        dVar18 = auVar19._0_8_;
      }
      dVar17 = dVar18 * 0.5;
      dVar18 = 0.5 / dVar18;
      dVar24 = (dVar10 + dVar29) * dVar18;
      dVar25 = (dVar11 + dVar13) * dVar18;
      dVar29 = dVar9 - dVar12;
    }
    else if (cVar14 == '\x01') {
      dVar17 = ((local_48.m_data[1] - local_68.m_data[2]) - local_98.m_data[0]) + 1.0;
      if (dVar17 < 0.0) {
        dVar18 = sqrt(dVar17);
      }
      else {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar17;
        auVar19 = vsqrtsd_avx(auVar21,auVar21);
        dVar18 = auVar19._0_8_;
      }
      dVar25 = dVar18 * 0.5;
      dVar18 = 0.5 / dVar18;
      dVar17 = (dVar11 + dVar13) * dVar18;
      dVar24 = (dVar12 + dVar9) * dVar18;
      dVar29 = dVar29 - dVar10;
    }
    else {
      dVar17 = ((local_98.m_data[0] - local_48.m_data[1]) - local_68.m_data[2]) + 1.0;
      if (dVar17 < 0.0) {
        dVar18 = sqrt(dVar17);
      }
      else {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar17;
        auVar19 = vsqrtsd_avx(auVar23,auVar23);
        dVar18 = auVar19._0_8_;
      }
      dVar24 = dVar18 * 0.5;
      dVar18 = 0.5 / dVar18;
      dVar25 = (dVar12 + dVar9) * dVar18;
      dVar17 = (dVar10 + dVar29) * dVar18;
      dVar29 = dVar13 - dVar11;
    }
    dVar18 = dVar29 * dVar18;
  }
  (__return_storage_ptr__->pos).m_data[0] = (this->pos2).m_data[0];
  (__return_storage_ptr__->pos).m_data[1] = (this->pos2).m_data[1];
  (__return_storage_ptr__->pos).m_data[2] = (this->pos2).m_data[2];
  (__return_storage_ptr__->rot).m_data[0] = dVar18;
  (__return_storage_ptr__->rot).m_data[1] = dVar24;
  (__return_storage_ptr__->rot).m_data[2] = dVar25;
  (__return_storage_ptr__->rot).m_data[3] = dVar17;
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkDistance::GetLinkRelativeCoords() {
    ChVector<> D2local;
    ChVector<> D2temp = (Vnorm(Body1->TransformPointLocalToParent(pos1) - Body2->TransformPointLocalToParent(pos2)));
    ChVector<> D2rel = Body2->TransformDirectionParentToLocal(D2temp);
    ChVector<> Vx, Vy, Vz;
    XdirToDxDyDz(D2rel, VECT_Y, Vx, Vy, Vz);
    ChMatrix33<> rel_matrix(Vx, Vy, Vz);

    Quaternion Ql2 = rel_matrix.Get_A_quaternion();
    return ChCoordsys<>(pos2, Ql2);
}